

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O0

uintptr_t lj_trace_unwind(jit_State *J,uintptr_t addr,ExitNo *ep)

{
  SnapNo SVar1;
  uint uVar2;
  ulong uVar3;
  SnapNo mid;
  uintptr_t ofs;
  SnapNo exitno;
  SnapNo lo;
  SnapShot *snap;
  GCtrace *T;
  TraceNo traceno;
  ExitNo *ep_local;
  uintptr_t addr_local;
  jit_State *J_local;
  MCode *local_18;
  
  uVar2._0_2_ = J[-1].bpropcache[6].key;
  uVar2._2_2_ = J[-1].bpropcache[6].val;
  uVar3 = (ulong)J->trace[uVar2].gcptr32;
  if (((uVar3 == 0) || (addr < *(ulong *)(uVar3 + 0x40))) ||
     (*(long *)(uVar3 + 0x40) + (ulong)*(uint *)(uVar3 + 0x3c) <= addr)) {
    local_18 = (MCode *)0x0;
  }
  else {
    lo = 0;
    exitno = (SnapNo)*(ushort *)(uVar3 + 6);
    do {
      SVar1 = lo + exitno >> 1;
      if ((ulong)*(ushort *)(*(long *)(uVar3 + 0x20) + (ulong)SVar1 * 0xc + 6) <=
          addr - *(long *)(uVar3 + 0x40)) {
        lo = SVar1 + 1;
        SVar1 = exitno;
      }
      exitno = SVar1;
    } while (lo < exitno);
    uVar2 = exitno - 1;
    *ep = uVar2;
    local_18 = J->exitstubgroup[uVar2 >> 5] + ((uVar2 & 0x1f) << 2);
  }
  return (uintptr_t)local_18;
}

Assistant:

uintptr_t LJ_FASTCALL lj_trace_unwind(jit_State *J, uintptr_t addr, ExitNo *ep)
{
#if EXITTRACE_VMSTATE
  TraceNo traceno = J2G(J)->vmstate;
#else
  TraceNo traceno = trace_exit_find(J, (MCode *)addr);
#endif
  GCtrace *T = traceref(J, traceno);
  if (T
#if EXITTRACE_VMSTATE
      && addr >= (uintptr_t)T->mcode && addr < (uintptr_t)T->mcode + T->szmcode
#endif
     ) {
    SnapShot *snap = T->snap;
    SnapNo lo = 0, exitno = T->nsnap;
    uintptr_t ofs = (uintptr_t)((MCode *)addr - T->mcode);  /* MCode units! */
    /* Rightmost binary search for mcode offset to determine exit number. */
    do {
      SnapNo mid = (lo+exitno) >> 1;
      if (ofs < snap[mid].mcofs) exitno = mid; else lo = mid + 1;
    } while (lo < exitno);
    exitno--;
    *ep = exitno;
#ifdef EXITSTUBS_PER_GROUP
    return (uintptr_t)exitstub_addr(J, exitno);
#else
    return (uintptr_t)exitstub_trace_addr(T, exitno);
#endif
  }
  lj_assertJ(0, "bad exit pc");
  return 0;
}